

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

bool ON_PointsAreCoincident(int dim,bool is_rat,int point_count,int point_stride,double *points)

{
  bool bVar1;
  int local_30;
  double *local_28;
  double *points_local;
  int local_18;
  int point_stride_local;
  int point_count_local;
  bool is_rat_local;
  int dim_local;
  
  if ((points == (double *)0x0) || (point_count < 2)) {
    is_rat_local = false;
  }
  else {
    local_30 = dim;
    if (is_rat) {
      local_30 = dim + 1;
    }
    if (point_stride < local_30) {
      is_rat_local = false;
    }
    else {
      bVar1 = ON_PointsAreCoincident(dim,is_rat,points,points + (point_count + -1) * point_stride);
      if (bVar1) {
        if (2 < point_count) {
          local_28 = points;
          local_18 = point_count + -1;
          while (local_18 != 0) {
            bVar1 = ON_PointsAreCoincident(dim,is_rat,local_28,local_28 + point_stride);
            if (!bVar1) {
              return false;
            }
            local_28 = local_28 + point_stride;
            local_18 = local_18 + -1;
          }
        }
        is_rat_local = true;
      }
      else {
        is_rat_local = false;
      }
    }
  }
  return is_rat_local;
}

Assistant:

bool ON_PointsAreCoincident(
    int dim,
    bool is_rat,
    int point_count,
    int point_stride,
    const double* points
    )
{
  if ( 0 == points || point_count < 2 )
    return false;
  if ( point_stride < (is_rat?(dim+1):dim) )
    return false;
  if ( false == ON_PointsAreCoincident( dim, is_rat, points, points + ((point_count-1)*point_stride) ) )
    return false;
  if ( point_count > 2 )
  {
    point_count--;
    while ( point_count-- )
    {
      if ( false == ON_PointsAreCoincident(dim,is_rat,points,points + point_stride ) )
        return false;
      points += point_stride;
    }
  }
  return true;
}